

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

void xercesc_4_0::XMLUri::normalizeURI(XMLCh *systemURI,XMLBuffer *normalizedURI)

{
  XMLCh XVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  
  normalizedURI->fIndex = 0;
  XVar2 = 0;
  do {
    while( true ) {
      XVar1 = *systemURI;
      if (XVar1 == L'%') break;
      if (XVar1 == L'\0') {
        return;
      }
LAB_00255b92:
      XVar3 = XVar2;
      if (XVar2 == normalizedURI->fCapacity) {
        XMLBuffer::ensureCapacity(normalizedURI,1);
        XVar3 = normalizedURI->fIndex;
      }
      XVar2 = XVar3 + 1;
      normalizedURI->fIndex = XVar2;
      normalizedURI->fBuffer[XVar3] = XVar1;
      systemURI = systemURI + 1;
    }
    if ((systemURI[1] != L'2') || (systemURI[2] != L'0')) goto LAB_00255b92;
    XVar3 = XVar2;
    if (XVar2 == normalizedURI->fCapacity) {
      XMLBuffer::ensureCapacity(normalizedURI,1);
      XVar3 = normalizedURI->fIndex;
    }
    systemURI = systemURI + 3;
    XVar2 = XVar3 + 1;
    normalizedURI->fIndex = XVar2;
    normalizedURI->fBuffer[XVar3] = L' ';
  } while( true );
}

Assistant:

void XMLUri::normalizeURI(const XMLCh*     const systemURI,
                                XMLBuffer&       normalizedURI)
{
    const XMLCh* pszSrc = systemURI;

    normalizedURI.reset();

    while (*pszSrc) {

        if ((*(pszSrc) == chPercent)
        &&  (*(pszSrc+1) == chDigit_2)
        &&  (*(pszSrc+2) == chDigit_0))
        {
            pszSrc += 3;
            normalizedURI.append(chSpace);
        }
        else
        {
            normalizedURI.append(*pszSrc);
            pszSrc++;
        }
    }
}